

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O3

Mat_<double> * cvlinspace(Mat_<double> *__return_storage_ptr__,double min_,double max_,int length)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  cv::Mat::Mat(&__return_storage_ptr__->super_Mat,1,length,6);
  auVar2 = _DAT_001090d0;
  if (0 < length) {
    lVar1 = *(long *)&__return_storage_ptr__->field_0x10;
    dVar8 = (max_ - min_) / (double)(length + -1);
    lVar3 = (ulong)(uint)length - 1;
    auVar5._8_4_ = (int)lVar3;
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_001090d0;
    auVar6 = _DAT_001090c0;
    do {
      auVar7 = auVar6 ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        *(double *)(lVar1 + uVar4 * 8) = (double)(int)uVar4 * dVar8 + min_;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        *(double *)(lVar1 + 8 + uVar4 * 8) = (double)((int)uVar4 + 1) * dVar8 + min_;
      }
      uVar4 = uVar4 + 2;
      lVar3 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar3 + 2;
    } while ((length + 1U & 0xfffffffe) != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> cvlinspace(double min_, double max_, int length) {
    auto cvmat = cv::Mat_<double>(1, length);
    for (int i = 0; i < length; i++) {
        cvmat(0, i) = ((max_ - min_) / (length - 1) * i) + min_;
    }
    return cvmat;
}